

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControl::setDocument(QWidgetTextControl *this,QTextDocument *document)

{
  QWidgetTextControlPrivate *this_00;
  QObject *this_01;
  QPaintDevice *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  if ((QObject *)this_00->doc != (QObject *)document) {
    QObject::disconnect((QObject *)this_00->doc,(QObject *)this,(char *)0x0);
    this_01 = (QObject *)QTextDocument::documentLayout();
    QObject::disconnect(this_01,(QObject *)this,(char *)0x0);
    pQVar1 = (QPaintDevice *)QTextDocument::documentLayout();
    QAbstractTextDocumentLayout::setPaintDevice(pQVar1);
    if (*(QWidgetTextControl **)(*(long *)(this_00->doc + 8) + 0x10) == this) {
      (**(code **)(*(long *)this_00->doc + 0x20))();
    }
    this_00->doc = (QTextDocument *)0x0;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    QWidgetTextControlPrivate::setContent(this_00,RichText,(QString *)&local_38,document);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::setDocument(QTextDocument *document)
{
    Q_D(QWidgetTextControl);
    if (d->doc == document)
        return;

    d->doc->disconnect(this);
    d->doc->documentLayout()->disconnect(this);
    d->doc->documentLayout()->setPaintDevice(nullptr);

    if (d->doc->parent() == this)
        delete d->doc;

    d->doc = nullptr;
    d->setContent(Qt::RichText, QString(), document);
}